

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

Result __thiscall
presolve::HPresolve::runProbing(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  _Any_data *p_Var1;
  double *pdVar2;
  pointer puVar3;
  double dVar4;
  double newLower;
  undefined8 uVar5;
  bool bVar6;
  HighsMipSolver *pHVar7;
  HighsMipSolverData *pHVar8;
  HighsMipSolverData *pHVar9;
  pointer pCVar10;
  pointer pHVar11;
  int *piVar12;
  pointer piVar13;
  pointer pdVar14;
  _Manager_type p_Var15;
  uint uVar16;
  HighsCliqueTable *this_00;
  bool bVar17;
  HighsInt HVar18;
  HighsInt HVar19;
  Result RVar20;
  long lVar21;
  HighsLp *pHVar22;
  long lVar23;
  CliqueVar CVar24;
  ulong uVar25;
  HighsDomain *pHVar26;
  long lVar27;
  HighsPostsolveStack *this_01;
  int iVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  HighsMipSolverData *pHVar32;
  long lVar33;
  HighsMipAnalysis *this_02;
  long lVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  iterator __begin2;
  int *piVar38;
  pointer ppVar39;
  uint uVar40;
  iterator __end2;
  ulong uVar41;
  pointer ptVar42;
  pointer ppVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  double dVar46;
  size_t numLiftOpps;
  vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
  binaries;
  HighsInt numBoundChgs;
  int local_f4;
  ulong local_f0;
  HighsCliqueTable *local_e8;
  long local_e0;
  ulong local_d8;
  HighsPostsolveStack *local_d0;
  ulong local_c8;
  HighsDomain *local_c0;
  int local_b8;
  HighsInt local_b4;
  uint local_b0;
  int local_ac;
  vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
  local_a8;
  _Manager_type *local_88;
  ulong local_80;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  _Any_data *local_50;
  ulong local_48;
  HighsImplications *local_40;
  pointer local_38;
  
  HighsMipAnalysis::mipTimerStart(&this->mipsolver->analysis_,0xb);
  this->probingEarlyAbort = false;
  if (this->numDeletedCols + this->numDeletedRows != 0) {
    shrinkProblem(this,postsolve_stack);
  }
  pHVar22 = this->model;
  toCSC(this,&(pHVar22->a_matrix_).value_,&(pHVar22->a_matrix_).index_,&(pHVar22->a_matrix_).start_)
  ;
  pHVar22 = this->model;
  okFromCSC(this,&(pHVar22->a_matrix_).value_,&(pHVar22->a_matrix_).index_,
            &(pHVar22->a_matrix_).start_);
  pHVar32 = (this->mipsolver->mipdata_)._M_t.
            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t
            .super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
            super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  (pHVar32->cliquetable).maxEntries =
       ((int)((ulong)((long)(this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3) -
       (int)((ulong)((long)(this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2)) * 10 + 2000000;
  pHVar22 = this->model;
  if (pHVar22->num_col_ != 0) {
    dVar46 = this->primal_feastol / 1e-14;
    uVar41 = 0;
    do {
      dVar4 = (pHVar22->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar41];
      newLower = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar41];
      if ((dVar4 < newLower) ||
         ((this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar41] <
          (pHVar22->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar41])) {
        if ((dVar4 < newLower) && (ABS(newLower) <= dVar46)) {
          changeColLower(this,(HighsInt)uVar41,newLower);
          pHVar22 = this->model;
        }
        dVar4 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar41];
        if ((ABS(dVar4) <= dVar46) &&
           (dVar4 < (pHVar22->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar41])) {
          changeColUpper(this,(HighsInt)uVar41,dVar4);
          pHVar22 = this->model;
        }
      }
      uVar41 = uVar41 + 1;
    } while (uVar41 != (uint)pHVar22->num_col_);
    pHVar32 = (this->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  }
  HVar18 = this->numProbed;
  HighsMipSolverData::setupDomainPropagation(pHVar32);
  pHVar32 = (this->mipsolver->mipdata_)._M_t.
            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t
            .super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
            super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  pHVar26 = &pHVar32->domain;
  HighsDomain::propagate(pHVar26);
  pHVar7 = this->mipsolver;
  if ((pHVar32->domain).infeasible_ != false) {
    this_02 = &pHVar7->analysis_;
    goto LAB_0030a8d3;
  }
  pHVar8 = (pHVar7->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_e8 = &pHVar8->cliquetable;
  bVar6 = pHVar8->cliquesExtracted;
  pHVar8->cliquesExtracted = true;
  if (bVar6 == false) {
    local_c0 = pHVar26;
    HighsCliqueTable::extractCliques(local_e8,pHVar7,true);
    pHVar7 = this->mipsolver;
    if ((pHVar32->domain).infeasible_ == true) {
      HighsMipAnalysis::mipTimerStop(&pHVar7->analysis_,0xb);
      return kPrimalInfeasible;
    }
    pHVar9 = (pHVar7->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    dVar46 = pHVar9->upper_limit;
    if (dVar46 < INFINITY) {
      pHVar9->upper_limit = dVar46 - this->model->offset_;
      HighsCliqueTable::extractObjCliques(local_e8,pHVar7);
      pHVar7 = this->mipsolver;
      ((pHVar7->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit = dVar46;
      if ((pHVar32->domain).infeasible_ == true) {
        this_02 = &pHVar7->analysis_;
        goto LAB_0030a8d3;
      }
    }
    pHVar26 = local_c0;
    HighsDomain::propagate(local_c0);
    if ((pHVar32->domain).infeasible_ != true) goto LAB_0030a4fc;
  }
  else {
LAB_0030a4fc:
    HighsCliqueTable::cleanupFixed(local_e8,pHVar26);
    if ((pHVar32->domain).infeasible_ != true) {
      local_a8.
      super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pHVar9 = (this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      if ((pHVar9->cliquetable).numEntries < (pHVar9->cliquetable).maxEntries) {
        std::
        vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>::
        reserve(&local_a8,(long)this->model->num_col_);
        this_00 = local_e8;
        local_40 = &pHVar8->implications;
        uVar41 = (ulong)(uint)(this->options->super_HighsOptionsStruct).random_seed;
        lVar21 = uVar41 + 0x8a183895eeac1536;
        do {
          uVar25 = ((uVar41 >> 0x20) + 0x80c8963be3e4c2f3) *
                   ((uVar41 & 0xffffffff) + 0xc8497d2a400d9551);
          uVar30 = ((uVar25 >> 0x20) + 0x42d8680e260ae5b) * lVar21 >> 0x20;
          uVar41 = uVar30 ^ uVar25;
        } while (uVar25 - uVar30 == 0);
        local_f0 = local_f0 & 0xffffffff00000000;
        pHVar22 = this->model;
        local_d0 = postsolve_stack;
        local_c0 = pHVar26;
        local_b4 = HVar18;
        if (pHVar22->num_col_ != 0) {
          iVar28 = 0;
          do {
            lVar21 = (long)iVar28;
            if ((((*(char *)(*(long *)&(((pHVar32->domain).mipsolver)->model_->integrality_).
                                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                       ._M_impl + lVar21) != '\0') &&
                 (dVar46 = *(double *)
                            (*(long *)&(pHVar32->domain).col_lower_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            lVar21 * 8), dVar46 == 0.0)) && (!NAN(dVar46))) &&
               ((dVar46 = *(double *)
                           (*(long *)&(pHVar32->domain).col_upper_.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl +
                           lVar21 * 8), dVar46 == 1.0 && (!NAN(dVar46))))) {
              HVar18 = HighsCliqueTable::getNumImplications(this_00,iVar28,true);
              HVar19 = HighsCliqueTable::getNumImplications(this_00,(HighsInt)local_f0,false);
              lVar21 = (long)HVar19 * (long)HVar18;
              if (4999 < lVar21) {
                lVar21 = 5000;
              }
              local_78._M_unused._0_8_ =
                   (undefined8)
                   ((double)-lVar21 /
                   ((double)(this->numProbes).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start[(HighsInt)local_f0] + 1.0));
              local_ac = HVar19 + HVar18;
              if (99 < local_ac) {
                local_ac = 100;
              }
              local_ac = -local_ac;
              uVar41 = uVar41 >> 0xc ^ uVar41;
              uVar41 = uVar41 << 0x19 ^ uVar41;
              uVar41 = uVar41 >> 0x1b ^ uVar41;
              local_b0 = (uint)(((uVar41 >> 0x20) + 0x80c8963be3e4c2f3) *
                                ((uVar41 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x21);
              std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>
              ::emplace_back<double,int,int,int&>
                        ((vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>
                          *)&local_a8,(double *)&local_78,&local_ac,(int *)&local_b0,
                         (int *)&local_f0);
              pHVar22 = this->model;
              iVar28 = (HighsInt)local_f0;
            }
            iVar28 = iVar28 + 1;
            local_f0 = CONCAT44(local_f0._4_4_,iVar28);
          } while (iVar28 != pHVar22->num_col_);
        }
        postsolve_stack = local_d0;
        if (local_a8.
            super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_a8.
            super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          uVar41 = ((long)local_a8.
                          super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_a8.
                          super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          iVar28 = 0;
          if (1 < uVar41) {
            iVar28 = 0;
            do {
              uVar41 = (long)uVar41 >> 1;
              iVar28 = iVar28 + 1;
            } while (1 < uVar41);
          }
          pdqsort_detail::
          pdqsort_loop<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>,false>
                    (local_a8.
                     super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_a8.
                     super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,iVar28,1);
          lVar21 = *(long *)&(pHVar32->domain).changedcols_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl;
          lVar35 = (long)*(pointer *)((long)&(pHVar32->domain).changedcols_ + 8) - lVar21;
          if (lVar35 == 0) {
            uVar41 = (ulong)(uint)this->probingNumDelCol;
            lVar35 = 0;
          }
          else {
            lVar35 = lVar35 >> 2;
            lVar27 = *(long *)&(pHVar32->domain).col_lower_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl;
            lVar23 = *(long *)&(pHVar32->domain).col_upper_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl;
            uVar41 = (ulong)(uint)this->probingNumDelCol;
            lVar31 = 0;
            do {
              lVar33 = (long)*(int *)(lVar21 + lVar31 * 4);
              dVar46 = *(double *)(lVar27 + lVar33 * 8);
              pdVar2 = (double *)(lVar23 + lVar33 * 8);
              if ((dVar46 == *pdVar2) && (!NAN(dVar46) && !NAN(*pdVar2))) {
                uVar40 = (int)uVar41 + 1;
                uVar41 = (ulong)uVar40;
                this->probingNumDelCol = uVar40;
              }
              lVar31 = lVar31 + 1;
            } while (lVar35 != lVar31);
          }
          pCVar10 = *(pointer *)((long)&(pHVar8->cliquetable).cliques + 8);
          lVar21 = *(long *)&(pHVar8->cliquetable).cliques.
                             super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                             ._M_impl;
          local_c8 = (long)*(pointer *)((long)&(pHVar8->cliquetable).freeslots + 8) -
                     *(long *)&(pHVar8->cliquetable).freeslots.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl;
          pHVar11 = *(pointer *)((long)&(pHVar8->implications).substitutions + 8);
          lVar27 = *(long *)&(pHVar8->implications).substitutions.
                             super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>
                             ._M_impl;
          local_d8 = (long)*(pointer *)((long)&(pHVar8->cliquetable).substitutions + 8) -
                     *(long *)&(pHVar8->cliquetable).substitutions.
                               super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                               ._M_impl;
          local_b8 = (int)(pHVar8->implications).numImplications;
          uVar40 = 100000;
          if (this->mipsolver->submip != false) {
            uVar40 = 0;
          }
          iVar28 = (int)((ulong)((long)(this->Avalue).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->Avalue).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 3) -
                   (int)((ulong)((long)(this->freeslots).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->freeslots).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2);
          uVar16 = iVar28 * 10;
          if (uVar40 == uVar16 || SBORROW4(uVar40,uVar16) != (int)(uVar40 + iVar28 * -10) < 0) {
            uVar40 = uVar16;
          }
          uVar25 = (long)this->model->num_row_ * 10;
          local_e0 = (ulong)uVar40 + (pHVar8->cliquetable).numNeighbourhoodQueries;
          local_48 = 100000;
          if (100000 < uVar25) {
            local_48 = uVar25;
          }
          local_f0 = 0;
          if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_lifting_for_probing !=
              -1) {
            lVar23 = (long)(this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
            if (lVar23 != 0) {
              lVar23 = lVar23 >> 2;
              lVar33 = 0;
              lVar34 = 0;
              lVar31 = 0;
              do {
                if ((this->colDeleted).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar33] == '\0') {
                  lVar31 = lVar31 + 1;
                  lVar34 = lVar34 + (ulong)((this->model->integrality_).
                                            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar33] ==
                                           kContinuous);
                }
                lVar33 = lVar33 + 1;
              } while (lVar23 + (ulong)(lVar23 == 0) != lVar33);
              if ((ulong)(lVar34 * 100) < (ulong)(lVar31 * 2)) goto LAB_0030aaaf;
            }
            local_78._M_unused._0_8_ =
                 (undefined8)
                 *(undefined8 *)
                  &(pHVar8->implications).storeLiftingOpportunity.super__Function_base._M_functor;
            local_78._8_4_ =
                 *(undefined4 *)((long)&(pHVar8->implications).storeLiftingOpportunity + 8);
            local_78._12_4_ =
                 *(undefined4 *)((long)&(pHVar8->implications).storeLiftingOpportunity + 0xc);
            *(HPresolve **)
             &(pHVar8->implications).storeLiftingOpportunity.super__Function_base._M_functor = this;
            *(ulong **)((long)&(pHVar8->implications).storeLiftingOpportunity + 8) = &local_f0;
            local_68 = *(_Manager_type *)
                        ((long)&(pHVar8->implications).storeLiftingOpportunity + 0x10);
            *(code **)((long)&(pHVar8->implications).storeLiftingOpportunity + 0x10) =
                 std::
                 _Function_handler<void_(int,_int,_int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/presolve/HPresolve.cpp:1529:46)>
                 ::_M_manager;
            local_60 = *(_Invoker_type *)
                        ((long)&(pHVar8->implications).storeLiftingOpportunity + 0x18);
            *(code **)((long)&(pHVar8->implications).storeLiftingOpportunity + 0x18) =
                 std::
                 _Function_handler<void_(int,_int,_int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/presolve/HPresolve.cpp:1529:46)>
                 ::_M_invoke;
            if (local_68 != (_Manager_type)0x0) {
              (*local_68)(&local_78,&local_78,__destroy_functor);
            }
          }
LAB_0030aaaf:
          local_38 = local_a8.
                     super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          local_80 = uVar41;
          if (local_a8.
              super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_a8.
              super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_c8 = (ulong)(uint)((int)(local_c8 >> 2) +
                                    (int)((ulong)((long)pCVar10 - lVar21) >> 2) * 0x33333333);
            local_d8 = (ulong)(uint)((int)(local_d8 >> 3) +
                                    (int)((ulong)((long)pHVar11 - lVar27) >> 3) * -0x55555555);
            local_88 = (_Manager_type *)
                       ((long)&(pHVar8->implications).storeLiftingOpportunity + 0x10);
            local_50 = (_Any_data *)&(pHVar8->implications).storeLiftingOpportunity;
            local_f4 = 0;
            ptVar42 = local_a8.
                      super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              iVar28 = (ptVar42->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                       super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                       super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
              lVar27 = (long)iVar28;
              lVar21 = (long)*(int *)(*(long *)&(pHVar8->cliquetable).colsubstituted.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl + lVar27 * 4);
              if ((((lVar21 == 0) ||
                   (*(long *)&(pHVar8->cliquetable).substitutions.
                              super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                              ._M_impl + lVar21 * 8 == 8)) &&
                  (*(char *)(*(long *)&(((pHVar32->domain).mipsolver)->model_->integrality_).
                                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                       ._M_impl + lVar27) != '\0')) &&
                 (((dVar46 = *(double *)
                              (*(long *)&(pHVar32->domain).col_lower_.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                              + lVar27 * 8), dVar46 == 0.0 && (!NAN(dVar46))) &&
                  ((dVar46 = *(double *)
                              (*(long *)&(pHVar32->domain).col_upper_.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                              + lVar27 * 8), dVar46 == 1.0 && (!NAN(dVar46))))))) {
                iVar29 = (this->model->num_col_ + this->model->num_row_) / 0x14;
                if (iVar29 < 0x3e9) {
                  iVar29 = 1000;
                }
                this->probingEarlyAbort = iVar29 < (int)local_d8;
                if ((iVar29 < (int)local_d8) ||
                   ((pHVar8->cliquetable).maxEntries <= (pHVar8->cliquetable).numEntries)) break;
                iVar37 = (int)((ulong)((long)*(pointer *)((long)&(pHVar8->cliquetable).cliques + 8)
                                      - *(long *)&(pHVar8->cliquetable).cliques.
                                                  super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                                  ._M_impl) >> 2) * -0x33333333 -
                         (int)((ulong)((long)*(pointer *)
                                              ((long)&(pHVar8->cliquetable).freeslots + 8) -
                                      *(long *)&(pHVar8->cliquetable).freeslots.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl) >> 2);
                iVar29 = ((int)((ulong)((long)(this->Avalue).
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->Avalue).
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 3) -
                         (int)((ulong)((long)(this->freeslots).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish -
                                      (long)(this->freeslots).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start) >> 2)) * 2;
                if (iVar29 < 0xf4241) {
                  iVar29 = 1000000;
                }
                if ((((iVar29 < iVar37 + (int)local_c8) ||
                     (iVar29 < (int)(pHVar8->implications).numImplications - local_b8)) ||
                    (local_e0 < (pHVar8->cliquetable).numNeighbourhoodQueries)) ||
                   (this->probingContingent < (long)this->numProbed)) break;
                local_78._M_unused._M_member_pointer =
                     local_78._M_unused._M_member_pointer & 0xffffffff00000000;
                bVar17 = HighsImplications::runProbing(local_40,iVar28,(HighsInt *)&local_78);
                if (bVar17) {
                  lVar21 = (long)(int)local_78._0_4_ + this->probingContingent;
                  this->probingContingent = lVar21;
                  iVar37 = ((int)((ulong)((long)*(pointer *)
                                                 ((long)&(pHVar8->cliquetable).cliques + 8) -
                                         *(long *)&(pHVar8->cliquetable).cliques.
                                                                                                      
                                                  super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                                  ._M_impl) >> 2) * -0x33333333 -
                           (int)((ulong)((long)*(pointer *)
                                                ((long)&(pHVar8->cliquetable).freeslots + 8) -
                                        *(long *)&(pHVar8->cliquetable).freeslots.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl) >> 2)) - iVar37;
                  iVar28 = 0;
                  if (0 < iVar37) {
                    iVar28 = iVar37;
                  }
                  lVar23 = *(long *)&(pHVar32->domain).changedcols_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl;
                  lVar31 = (long)*(pointer *)((long)&(pHVar32->domain).changedcols_ + 8) - lVar23 >>
                           2;
                  iVar29 = this->probingNumDelCol;
                  if (lVar31 != lVar35) {
                    lVar33 = *(long *)&(pHVar32->domain).col_lower_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl;
                    lVar34 = *(long *)&(pHVar32->domain).col_upper_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl;
                    lVar36 = lVar35;
                    do {
                      lVar35 = (long)*(int *)(lVar23 + lVar36 * 4);
                      dVar46 = *(double *)(lVar33 + lVar35 * 8);
                      pdVar2 = (double *)(lVar34 + lVar35 * 8);
                      if ((dVar46 == *pdVar2) && (!NAN(dVar46) && !NAN(*pdVar2))) {
                        iVar29 = iVar29 + 1;
                        this->probingNumDelCol = iVar29;
                      }
                      lVar36 = lVar36 + 1;
                      lVar35 = lVar31;
                    } while (lVar31 != lVar36);
                  }
                  uVar40 = (int)((ulong)((long)*(pointer *)
                                                ((long)&(pHVar8->cliquetable).substitutions + 8) -
                                        *(long *)&(pHVar8->cliquetable).substitutions.
                                                  super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                                                  ._M_impl) >> 3) + (iVar29 - (int)local_80) +
                           (int)((ulong)((long)*(pointer *)
                                                ((long)&(pHVar8->implications).substitutions + 8) -
                                        *(long *)&(pHVar8->implications).substitutions.
                                                  super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>
                                                  ._M_impl) >> 3) * -0x55555555;
                  if ((int)local_d8 < (int)uVar40) {
                    this->probingContingent = lVar21 + (int)local_d8;
                    local_f4 = 0;
                    if (this->mipsolver->submip == false) {
                      local_e0 = local_e0 + (ulong)(uint)(iVar28 * 1000) +
                                 (long)(int)(((int)local_80 + uVar40) * 100);
                    }
                    uVar41 = (ulong)uVar40;
                  }
                  else {
                    uVar41 = local_d8;
                    if ((this->mipsolver->submip == false) && (0 < iVar37)) {
                      local_e0 = local_e0 + (ulong)(uint)(iVar28 * 1000);
                      local_f4 = 0;
                    }
                    else {
                      local_e0 = local_e0 - local_f4 * 100;
                      local_f4 = local_f4 + 1;
                    }
                  }
                  this->numProbed = this->numProbed + 1;
                  puVar3 = (this->numProbes).
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar27;
                  *puVar3 = *puVar3 + 1;
                  if ((local_48 <= local_f0) && (*local_88 != (_Manager_type)0x0)) {
                    (**local_88)(local_50,local_50,__destroy_functor);
                    *local_88 = (_Manager_type)0x0;
                    local_88[1] = (_Manager_type)0x0;
                  }
                  local_d8 = uVar41;
                  if ((pHVar32->domain).infeasible_ == true) {
                    HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,0xb);
                    RVar20 = kPrimalInfeasible;
                    goto LAB_0030b20e;
                  }
                }
              }
              ptVar42 = ptVar42 + 1;
            } while (ptVar42 != local_38);
          }
          pHVar26 = local_c0;
          HighsCliqueTable::cleanupFixed(local_e8,local_c0);
          if (bVar6 != false) {
            HighsCliqueTable::extractCliques(local_e8,this->mipsolver,false);
          }
          HighsCliqueTable::runCliqueMerging(local_e8,pHVar26);
          this_01 = local_d0;
          piVar38 = *(int **)&(pHVar8->cliquetable).deletedrows.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl;
          piVar12 = *(pointer *)((long)&(pHVar8->cliquetable).deletedrows + 8);
          if (piVar38 != piVar12) {
            do {
              if ((this->rowDeleted).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[*piVar38] == '\0') {
                removeRow(this,*piVar38);
              }
              piVar38 = piVar38 + 1;
            } while (piVar38 != piVar12);
            piVar13 = *(pointer *)
                       &(pHVar8->cliquetable).deletedrows.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl;
            if (*(pointer *)((long)&(pHVar8->cliquetable).deletedrows + 8) != piVar13) {
              *(pointer *)((long)&(pHVar8->cliquetable).deletedrows + 8) = piVar13;
            }
          }
          ppVar39 = *(pointer *)
                     &(pHVar8->cliquetable).cliqueextensions.
                      super__Vector_base<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
                      ._M_impl;
          ppVar43 = *(pointer *)((long)&(pHVar8->cliquetable).cliqueextensions + 8);
          uVar41 = (ulong)((long)ppVar43 - (long)ppVar39) >> 3;
          iVar28 = (int)uVar41;
          if (ppVar43 != ppVar39) {
            do {
              iVar28 = ppVar39->first;
              if ((this->rowDeleted).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar28] == '\0') {
                CVar24 = ppVar39->second;
                uVar40 = 0x3ff00000;
                if (-1 < (int)CVar24) {
                  pHVar22 = this->model;
                  pdVar14 = (pHVar22->row_lower_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pdVar14[iVar28] = pdVar14[iVar28] + -1.0;
                  pdVar14 = (pHVar22->row_upper_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pdVar14[iVar28] = pdVar14[iVar28] + -1.0;
                  CVar24 = ppVar39->second;
                  uVar40 = 0xbff00000;
                }
                addToMatrix(this,iVar28,(uint)CVar24 & 0x7fffffff,(double)((ulong)uVar40 << 0x20));
              }
              else {
                uVar41 = (ulong)((int)uVar41 - 1);
              }
              iVar28 = (int)uVar41;
              ppVar39 = ppVar39 + 1;
            } while (ppVar39 != ppVar43);
            ppVar39 = *(pointer *)
                       &(pHVar8->cliquetable).cliqueextensions.
                        super__Vector_base<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
                        ._M_impl;
            ppVar43 = *(pointer *)((long)&(pHVar8->cliquetable).cliqueextensions + 8);
          }
          if (ppVar43 != ppVar39) {
            *(pointer *)((long)&(pHVar8->cliquetable).cliqueextensions + 8) = ppVar39;
          }
          pHVar22 = this->model;
          uVar40 = pHVar22->num_col_;
          if (uVar40 != 0) {
            uVar41 = 0;
            do {
              if ((this->colDeleted).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar41] == '\0') {
                dVar46 = *(double *)
                          (*(long *)&(pHVar32->domain).col_lower_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          uVar41 * 8);
                pdVar2 = (pHVar22->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar41;
                HVar18 = (HighsInt)uVar41;
                if (*pdVar2 <= dVar46 && dVar46 != *pdVar2) {
                  changeColLower(this,HVar18,dVar46);
                  pHVar22 = this->model;
                }
                dVar46 = *(double *)
                          (*(long *)&(pHVar32->domain).col_upper_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          uVar41 * 8);
                uVar44 = SUB84(dVar46,0);
                uVar45 = (undefined4)((ulong)dVar46 >> 0x20);
                if (dVar46 < (pHVar22->col_upper_).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar41]) {
                  changeColUpper(this,HVar18,dVar46);
                  uVar5 = *(undefined8 *)
                           (*(long *)&(pHVar32->domain).col_upper_.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl +
                           uVar41 * 8);
                  uVar44 = (undefined4)uVar5;
                  uVar45 = (undefined4)((ulong)uVar5 >> 0x20);
                }
                dVar46 = *(double *)
                          (*(long *)&(pHVar32->domain).col_lower_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          uVar41 * 8);
                if ((dVar46 == (double)CONCAT44(uVar45,uVar44)) &&
                   (!NAN(dVar46) && !NAN((double)CONCAT44(uVar45,uVar44)))) {
                  HighsPostsolveStack::removedFixedCol<HighsEmptySlice>
                            (this_01,HVar18,
                             (this->model->col_lower_).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar41],0.0,
                             (HighsMatrixSlice<HighsEmptySlice> *)&local_78);
                  removeFixedCol(this,HVar18);
                }
                RVar20 = checkLimits(this,this_01);
                if (RVar20 != kOk) goto LAB_0030b20e;
                pHVar22 = this->model;
                uVar40 = pHVar22->num_col_;
                this_01 = local_d0;
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar40);
          }
          RVar20 = applyConflictGraphSubstitutions(this,this_01);
          if (RVar20 != kOk) goto LAB_0030b20e;
          highsLogDev(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                      "%d probing evaluations: %d deleted rows, %d deleted columns, %d lifted nonzeros\n"
                      ,(ulong)(uint)(this->numProbed - local_b4),(ulong)(uint)this->numDeletedRows,
                      (ulong)(uint)this->numDeletedCols,iVar28);
          postsolve_stack = local_d0;
          if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_lifting_for_probing !=
              -1) {
            if (((this->numDeletedRows == 0) && (iVar28 == 0 && this->numDeletedCols == 0)) &&
               (RVar20 = liftingForProbing(this,local_d0), RVar20 != kOk)) goto LAB_0030b20e;
            std::
            _Hashtable<int,_std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>,_std::allocator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::clear(&(this->liftingOpportunities)._M_h);
            p_Var15 = *(_Manager_type *)
                       ((long)&(pHVar8->implications).storeLiftingOpportunity + 0x10);
            postsolve_stack = local_d0;
            if (p_Var15 != (_Manager_type)0x0) {
              p_Var1 = (_Any_data *)&(pHVar8->implications).storeLiftingOpportunity;
              (*p_Var15)(p_Var1,p_Var1,__destroy_functor);
              *(_Manager_type *)((long)&(pHVar8->implications).storeLiftingOpportunity + 0x10) =
                   (_Manager_type)0x0;
              *(_Invoker_type *)((long)&(pHVar8->implications).storeLiftingOpportunity + 0x18) =
                   (_Invoker_type)0x0;
              postsolve_stack = local_d0;
            }
          }
        }
      }
      HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,0xb);
      RVar20 = checkLimits(this,postsolve_stack);
LAB_0030b20e:
      if (local_a8.
          super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return RVar20;
      }
      operator_delete(local_a8.
                      super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      return RVar20;
    }
  }
  this_02 = &this->mipsolver->analysis_;
LAB_0030a8d3:
  HighsMipAnalysis::mipTimerStop(this_02,0xb);
  return kPrimalInfeasible;
}

Assistant:

HPresolve::Result HPresolve::runProbing(HighsPostsolveStack& postsolve_stack) {
  mipsolver->analysis_.mipTimerStart(kMipClockProbingPresolve);
  probingEarlyAbort = false;
  if (numDeletedCols + numDeletedRows != 0) shrinkProblem(postsolve_stack);

  toCSC(model->a_matrix_.value_, model->a_matrix_.index_,
        model->a_matrix_.start_);
  okFromCSC(model->a_matrix_.value_, model->a_matrix_.index_,
            model->a_matrix_.start_);

  mipsolver->mipdata_->cliquetable.setMaxEntries(numNonzeros());

  // first tighten all bounds if they have an implied bound that is tighter
  // than their column bound before probing this is not done for continuous
  // columns since it may allow stronger dual presolve and more aggregations
  double hugeBound = primal_feastol / kHighsTiny;
  for (HighsInt i = 0; i != model->num_col_; ++i) {
    if (model->col_lower_[i] >= implColLower[i] &&
        model->col_upper_[i] <= implColUpper[i])
      continue;

    if (std::abs(implColLower[i]) <= hugeBound) {
      double newLb = implColLower[i];
      if (newLb > model->col_lower_[i]) changeColLower(i, newLb);
    }

    if (std::abs(implColUpper[i]) <= hugeBound) {
      double newUb = implColUpper[i];
      if (newUb < model->col_upper_[i]) changeColUpper(i, newUb);
    }
  }

  HighsInt oldNumProbed = numProbed;

  mipsolver->mipdata_->setupDomainPropagation();
  HighsDomain& domain = mipsolver->mipdata_->domain;

  domain.propagate();
  if (domain.infeasible()) {
    mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
    return Result::kPrimalInfeasible;
  }
  HighsCliqueTable& cliquetable = mipsolver->mipdata_->cliquetable;
  HighsImplications& implications = mipsolver->mipdata_->implications;
  bool firstCall = !mipsolver->mipdata_->cliquesExtracted;
  mipsolver->mipdata_->cliquesExtracted = true;

  // extract cliques that are part of the formulation every time before probing
  // after the first call we only add cliques that directly correspond to set
  // packing constraints so that the clique merging step can extend/delete them
  if (firstCall) {
    cliquetable.extractCliques(*mipsolver);
    if (domain.infeasible()) {
      mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
      return Result::kPrimalInfeasible;
    }

    // during presolve we keep the objective upper bound without the current
    // offset so we need to update it

    if (mipsolver->mipdata_->upper_limit != kHighsInf) {
      double tmpLimit = mipsolver->mipdata_->upper_limit;
      mipsolver->mipdata_->upper_limit = tmpLimit - model->offset_;
      cliquetable.extractObjCliques(*mipsolver);
      mipsolver->mipdata_->upper_limit = tmpLimit;

      if (domain.infeasible()) {
        mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
        return Result::kPrimalInfeasible;
      }
    }

    domain.propagate();
    if (domain.infeasible()) {
      mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
      return Result::kPrimalInfeasible;
    }
  }

  cliquetable.cleanupFixed(domain);
  if (domain.infeasible()) {
    mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
    return Result::kPrimalInfeasible;
  }

  // store binary variables in vector with their number of implications on
  // other binaries
  std::vector<std::tuple<int64_t, HighsInt, HighsInt, HighsInt>> binaries;

  if (!mipsolver->mipdata_->cliquetable.isFull()) {
    binaries.reserve(model->num_col_);
    HighsRandom random(options->random_seed);
    for (HighsInt i = 0; i != model->num_col_; ++i) {
      if (domain.isBinary(i)) {
        HighsInt implicsUp = cliquetable.getNumImplications(i, 1);
        HighsInt implicsDown = cliquetable.getNumImplications(i, 0);
        binaries.emplace_back(
            -std::min(int64_t{5000}, int64_t(implicsUp) * implicsDown) /
                (1.0 + numProbes[i]),
            -std::min(HighsInt{100}, implicsUp + implicsDown), random.integer(),
            i);
      }
    }
  }
  if (!binaries.empty()) {
    // sort variables with many implications on other binaries first
    pdqsort(binaries.begin(), binaries.end());

    size_t numChangedCols = 0;
    while (domain.getChangedCols().size() != numChangedCols) {
      if (domain.isFixed(domain.getChangedCols()[numChangedCols++]))
        ++probingNumDelCol;
    }

    HighsInt numCliquesStart = cliquetable.numCliques();
    HighsInt numImplicsStart = implications.getNumImplications();
    HighsInt numDelStart = probingNumDelCol;

    HighsInt numDel = probingNumDelCol - numDelStart +
                      implications.substitutions.size() +
                      cliquetable.getSubstitutions().size();
    int64_t splayContingent =
        cliquetable.numNeighbourhoodQueries +
        std::max(mipsolver->submip ? HighsInt{0} : HighsInt{100000},
                 10 * numNonzeros());
    HighsInt numFail = 0;

    // lambda to check if model has enough continuous variables to perform
    // lifting for probing
    auto modelHasPercentageContVars = [&](size_t percentage) {
      size_t num_cols = 0, num_cont_cols = 0;
      for (size_t col = 0; col < colsize.size(); col++) {
        if (colDeleted[col]) continue;
        num_cols++;
        if (model->integrality_[col] == HighsVarType::kContinuous)
          num_cont_cols++;
      }
      return size_t{100} * num_cont_cols >= percentage * num_cols;
    };

    // collect up to 10 lifting opportunities per row
    const size_t maxNumLiftOpps = std::max(
        size_t{100000}, size_t{10} * static_cast<size_t>(model->num_row_));

    // only search for lifting opportunities if at least 2 percent of the
    // variables in the problem are continuous
    size_t numLiftOpps = 0;
    if (mipsolver->options_mip_->mip_lifting_for_probing != -1 &&
        modelHasPercentageContVars(size_t{2})) {
      // store lifting opportunities
      implications.storeLiftingOpportunity = [&](HighsInt row, HighsInt col,
                                                 HighsInt val, double coef) {
        // find lifting opportunities for row
        auto& htree = liftingOpportunities[row];
        // add element
        auto insertresult = htree.insert_or_get(std::make_pair(col, val), coef);
        assert(insertresult.second);
        numLiftOpps++;
      };
    }

    for (const auto& binvar : binaries) {
      HighsInt i = std::get<3>(binvar);

      if (cliquetable.getSubstitution(i) != nullptr || !domain.isBinary(i))
        continue;

      // when a large percentage of columns have been deleted, stop this round
      // of probing
      // if (numDel > std::max(model->num_col_ * 0.2, 1000.)) break;
      probingEarlyAbort =
          numDel >
          std::max(HighsInt{1000}, (model->num_row_ + model->num_col_) / 20);
      if (probingEarlyAbort) break;

      // break in case of too many new implications to not spent ages in
      // probing
      if (cliquetable.isFull() ||
          cliquetable.numCliques() - numCliquesStart >
              std::max(HighsInt{1000000}, 2 * numNonzeros()) ||
          implications.getNumImplications() - numImplicsStart >
              std::max(HighsInt{1000000}, 2 * numNonzeros()))
        break;

      // if (numProbed % 10 == 0)
      //   printf(
      //       "numprobed=%d  numDel=%d  newcliques=%d "
      //       "numNeighbourhoodQueries=%ld  "
      //       "splayContingent=%ld\n",
      //       numProbed, numDel, cliquetable.numCliques() - numCliquesStart,
      //       cliquetable.numNeighbourhoodQueries, splayContingent);
      if (cliquetable.numNeighbourhoodQueries > splayContingent) break;

      if (probingContingent - numProbed < 0) break;

      HighsInt numBoundChgs = 0;
      HighsInt numNewCliques = -cliquetable.numCliques();
      const bool probing_result = implications.runProbing(i, numBoundChgs);
      if (!probing_result) continue;
      probingContingent += numBoundChgs;
      numNewCliques += cliquetable.numCliques();
      numNewCliques = std::max(numNewCliques, HighsInt{0});
      while (domain.getChangedCols().size() != numChangedCols) {
        if (domain.isFixed(domain.getChangedCols()[numChangedCols++]))
          ++probingNumDelCol;
      }
      HighsInt newNumDel = probingNumDelCol - numDelStart +
                           implications.substitutions.size() +
                           cliquetable.getSubstitutions().size();

      if (newNumDel > numDel) {
        probingContingent += numDel;
        if (!mipsolver->submip) {
          splayContingent += 100 * (newNumDel + numDelStart);
          splayContingent += 1000 * numNewCliques;
        }
        numDel = newNumDel;
        numFail = 0;
      } else if (mipsolver->submip || numNewCliques == 0) {
        splayContingent -= 100 * numFail;
        ++numFail;
      } else {
        splayContingent += 1000 * numNewCliques;
        numFail = 0;
      }

      ++numProbed;
      numProbes[i] += 1;

      // Stop collecting lifting opportunities if maximum is reached
      if (numLiftOpps >= maxNumLiftOpps)
        implications.storeLiftingOpportunity = nullptr;

      // printf("nprobed: %" HIGHSINT_FORMAT ", numCliques: %" HIGHSINT_FORMAT
      // "\n", nprobed,
      //       cliquetable.numCliques());
      if (domain.infeasible()) {
        mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
        return Result::kPrimalInfeasible;
      }
    }

    cliquetable.cleanupFixed(domain);

    if (!firstCall) cliquetable.extractCliques(*mipsolver, false);
    cliquetable.runCliqueMerging(domain);

    // apply changes from probing

    // first delete redundant clique inequalities
    for (HighsInt delrow : cliquetable.getDeletedRows())
      if (!rowDeleted[delrow]) removeRow(delrow);
    cliquetable.getDeletedRows().clear();

    // add nonzeros from clique lifting before removing fixed variables, since
    // this might lead to stronger constraint sides
    auto& extensionvars = cliquetable.getCliqueExtensions();
    HighsInt addednnz = extensionvars.size();
    for (const auto& cliqueextension : extensionvars) {
      if (rowDeleted[cliqueextension.first]) {
        --addednnz;
        continue;
      }
      double val;
      if (cliqueextension.second.val == 0) {
        model->row_lower_[cliqueextension.first] -= 1;
        model->row_upper_[cliqueextension.first] -= 1;
        val = -1.0;
      } else
        val = 1.0;
      addToMatrix(cliqueextension.first, cliqueextension.second.col, val);
    }
    extensionvars.clear();

    // now remove fixed columns and tighten domains
    for (HighsInt i = 0; i != model->num_col_; ++i) {
      if (colDeleted[i]) continue;
      if (model->col_lower_[i] < domain.col_lower_[i])
        changeColLower(i, domain.col_lower_[i]);
      if (model->col_upper_[i] > domain.col_upper_[i])
        changeColUpper(i, domain.col_upper_[i]);
      if (domain.isFixed(i)) {
        postsolve_stack.removedFixedCol(i, model->col_lower_[i], 0.0,
                                        HighsEmptySlice());
        removeFixedCol(i);
      }
      HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
    }

    // finally apply substitutions
    HPRESOLVE_CHECKED_CALL(applyConflictGraphSubstitutions(postsolve_stack));

    highsLogDev(options->log_options, HighsLogType::kInfo,
                "%" HIGHSINT_FORMAT " probing evaluations: %" HIGHSINT_FORMAT
                " deleted rows, %" HIGHSINT_FORMAT
                " deleted "
                "columns, %" HIGHSINT_FORMAT " lifted nonzeros\n",
                numProbed - oldNumProbed, numDeletedRows, numDeletedCols,
                addednnz);

    // lifting for probing
    if (mipsolver->options_mip_->mip_lifting_for_probing != -1) {
      // only perform lifting if probing did not modify the problem so far
      if (numDeletedRows == 0 && numDeletedCols == 0 && addednnz == 0)
        HPRESOLVE_CHECKED_CALL(liftingForProbing(postsolve_stack));
      // clear lifting opportunities
      liftingOpportunities.clear();
      implications.storeLiftingOpportunity = nullptr;
    }
  }

  mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
  return checkLimits(postsolve_stack);
}